

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_lib.c
# Opt level: O0

int EC_POINT_set_to_infinity(EC_GROUP *group,EC_POINT *point)

{
  undefined4 local_4;
  
  if (*(long *)(*(long *)group + 0x70) == 0) {
    local_4 = 0;
  }
  else if (*(long *)group == *(long *)point) {
    local_4 = (**(code **)(*(long *)group + 0x70))(group,point);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int EC_POINT_set_to_infinity(const EC_GROUP *group, EC_POINT *point)
{
    if (group->meth->point_set_to_infinity == 0) {
        //ECerr(EC_F_EC_POINT_SET_TO_INFINITY,
            //   ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
        return 0;
    }
    if (group->meth != point->meth) {
        //ECerr(EC_F_EC_POINT_SET_TO_INFINITY, EC_R_INCOMPATIBLE_OBJECTS);
        return 0;
    }
    return group->meth->point_set_to_infinity(group, point);
}